

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O2

stStateCore * __thiscall TripleBuffer<stStateCore>::get(TripleBuffer<stStateCore> *this)

{
  std::mutex::lock(&this->mutex);
  if (this->hasChanged == true) {
    stStateCore::operator=(&this->out,&this->buffer);
    this->hasChanged = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return &this->out;
}

Assistant:

const T & get() {
        std::lock_guard<std::mutex> lock(mutex);
        if (hasChanged) {
            out = buffer;
            hasChanged = false;
        }

        return out;
    }